

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_round_box.cxx
# Opt level: O1

void draw(int which,int x,int y,int w,int h,int inset,Fl_Color color)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  int iVar3;
  uint uVar4;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  code *pcVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  double local_50;
  ulong uVar2;
  ulong uVar5;
  
  if (w <= inset * 2) {
    inset = (w - (w + -1 >> 0x1f)) + -1 >> 1;
  }
  if (h <= inset * 2) {
    inset = (h - (h + -1 >> 0x1f)) + -1 >> 1;
  }
  uVar12 = w + inset * -2;
  uVar10 = h + inset * -2;
  uVar13 = uVar12;
  if (h < w) {
    uVar13 = uVar10;
  }
  if ((int)uVar13 < 2) {
    return;
  }
  uVar4 = x + inset;
  uVar5 = (ulong)uVar4;
  uVar1 = y + inset;
  uVar2 = (ulong)uVar1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)color);
  pcVar9 = fl_arc_i;
  if (which == 3) {
    pcVar9 = fl_pie;
  }
  if (which < 2) {
    if (which == 0) {
      iVar11 = 0xb4;
      if (h < w) {
        iVar11 = 0x5a;
      }
      (*pcVar9)(0x4046800000000000,(uVar12 + uVar4) - uVar13,uVar2,uVar13,uVar13);
      uVar7 = (ulong)((uVar10 + uVar1) - uVar13);
      uVar14 = 0x406c200000000000;
      uVar8 = uVar5;
    }
    else {
      iVar11 = 0x168;
      if (h < w) {
        iVar11 = 0x10e;
      }
      (*pcVar9)(0x406c200000000000,uVar5,(uVar10 + uVar1) - uVar13,uVar13,uVar13);
      uVar14 = 0x4079500000000000;
      uVar7 = uVar2;
      uVar8 = (ulong)((uVar12 + uVar4) - uVar13);
    }
    local_50 = (double)iVar11;
    (*pcVar9)(local_50,uVar14,uVar8,uVar7,uVar13,uVar13);
  }
  else {
    iVar11 = -0x5a;
    if (w <= h) {
      iVar11 = 0;
    }
    iVar3 = 0xb4;
    if (h < w) {
      iVar3 = 0x5a;
    }
    iVar6 = 0x168;
    if (h < w) {
      iVar6 = 0x10e;
    }
    (*pcVar9)((double)iVar11,(uVar12 + uVar4) - uVar13,uVar2,uVar13,uVar13);
    (*pcVar9)((double)iVar3,(double)iVar6,uVar5,(uVar10 + uVar1) - uVar13,uVar13,uVar13);
  }
  if (which != 3) {
    if (w < h) {
      if ((which != 0) &&
         ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)((uVar12 + uVar4) - 1),
                     (ulong)((uVar1 + (uVar13 >> 1)) - 1),
                     (ulong)(((uVar1 + uVar10) - (uVar13 >> 1)) + 1)), which == 1)) {
        return;
      }
      uVar2 = (ulong)((uVar1 + (uVar13 >> 1)) - 1);
      iVar11 = (uVar10 + uVar1) - (uVar13 >> 1);
      UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
    }
    else {
      if (w <= h) {
        return;
      }
      if ((which != 0) &&
         ((*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)((uVar4 + (uVar13 >> 1)) - 1),
                     (ulong)((uVar10 + uVar1) - 1),(ulong)(((uVar12 + uVar4) - (uVar13 >> 1)) + 1)),
         which == 1)) {
        return;
      }
      uVar5 = (ulong)((uVar4 + (uVar13 >> 1)) - 1);
      iVar11 = (uVar12 + uVar4) - (uVar13 >> 1);
      UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
    }
    (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,uVar5,uVar2,(ulong)(iVar11 + 1));
    return;
  }
  if (w < h) {
    uVar2 = (ulong)((uVar13 >> 1) + uVar1);
    uVar10 = uVar10 - (uVar13 & 0x7ffffffe);
    UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
  }
  else {
    if (w <= h) {
      return;
    }
    uVar5 = (ulong)((uVar13 >> 1) + uVar4);
    uVar12 = uVar12 - (uVar13 & 0x7ffffffe);
    UNRECOVERED_JUMPTABLE_00 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
  }
  (*UNRECOVERED_JUMPTABLE_00)(fl_graphics_driver,uVar5,uVar2,(ulong)uVar12,uVar10);
  return;
}

Assistant:

static void draw(int which, int x,int y,int w,int h, int inset, Fl_Color color)
{
  if (inset*2 >= w) inset = (w-1)/2;
  if (inset*2 >= h) inset = (h-1)/2;
  x += inset;
  y += inset;
  w -= 2*inset;
  h -= 2*inset;
  int d = w <= h ? w : h;
  if (d <= 1) return;
  fl_color(color);
  void (*f)(int,int,int,int,double,double);
  f = (which==FILL) ? fl_pie : fl_arc_i;
  if (which >= CLOSED) {
    f(x+w-d, y, d, d, w<=h ? 0 : -90, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, w<=h ? 360 : 270);
  } else if (which == UPPER_LEFT) {
    f(x+w-d, y, d, d, 45, w<=h ? 180 : 90);
    f(x, y+h-d, d, d, w<=h ? 180 : 90, 225);
  } else { // LOWER_RIGHT
    f(x, y+h-d, d, d, 225, w<=h ? 360 : 270);
    f(x+w-d, y, d, d, w<=h ? 360 : 270, 360+45);
  }
  if (which == FILL) {
    if (w < h)
      fl_rectf(x, y+d/2, w, h-(d&-2));
    else if (w > h)
      fl_rectf(x+d/2, y, w-(d&-2), h);
  } else {
    if (w < h) {
      if (which != UPPER_LEFT) fl_yxline(x+w-1, y+d/2-1, y+h-d/2+1);
      if (which != LOWER_RIGHT) fl_yxline(x, y+d/2-1, y+h-d/2+1);
    } else if (w > h) {
      if (which != UPPER_LEFT) fl_xyline(x+d/2-1, y+h-1, x+w-d/2+1);
      if (which != LOWER_RIGHT) fl_xyline(x+d/2-1, y, x+w-d/2+1);
    }
  }
}